

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

TabletPointData * QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)

{
  long *plVar1;
  pointer pTVar2;
  pointer pTVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  pointer unaff_R15;
  long in_FS_OFFSET;
  bool bVar7;
  TabletPointData local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = tabletDevicePoints.d.size != 0;
  if ((bVar7) &&
     (pTVar2 = QList<QGuiApplicationPrivate::TabletPointData>::data(&tabletDevicePoints),
     unaff_R15 = pTVar2, pTVar2->deviceId != deviceId)) {
    uVar6 = 0;
    lVar5 = 0x18;
    do {
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < (ulong)tabletDevicePoints.d.size;
      unaff_R15 = pTVar2;
      if ((ulong)tabletDevicePoints.d.size <= uVar6) break;
      pTVar3 = QList<QGuiApplicationPrivate::TabletPointData>::data(&tabletDevicePoints);
      plVar1 = (long *)((long)&pTVar3->deviceId + lVar5);
      unaff_R15 = (pointer)((long)&pTVar3->deviceId + lVar5);
      lVar5 = lVar5 + 0x18;
    } while (*plVar1 != deviceId);
  }
  if (!bVar7) {
    local_50.state.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
    super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorageHelper<Qt::MouseButton,_4>)(QFlagsStorage<Qt::MouseButton>)0x0;
    local_50.target = (QWindow *)0x0;
    local_50.deviceId = deviceId;
    QtPrivate::QMovableArrayOps<QGuiApplicationPrivate::TabletPointData>::
    emplace<QGuiApplicationPrivate::TabletPointData>
              ((QMovableArrayOps<QGuiApplicationPrivate::TabletPointData> *)&tabletDevicePoints,
               tabletDevicePoints.d.size,&local_50);
    QList<QGuiApplicationPrivate::TabletPointData>::end(&tabletDevicePoints);
    iVar4 = QList<QGuiApplicationPrivate::TabletPointData>::end(&tabletDevicePoints);
    unaff_R15 = iVar4.i + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return unaff_R15;
  }
  __stack_chk_fail();
}

Assistant:

QGuiApplicationPrivate::TabletPointData &QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)
{
    for (int i = 0; i < tabletDevicePoints.size(); ++i) {
        TabletPointData &pointData = tabletDevicePoints[i];
        if (pointData.deviceId == deviceId)
            return pointData;
    }

    tabletDevicePoints.append(TabletPointData(deviceId));
    return tabletDevicePoints.last();
}